

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O2

_Bool str_matches_any(char *haystack,char **needles,int num_needles)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  if (haystack == (char *)0x0) {
    __assert_fail("haystack != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x260,"_Bool str_matches_any(const char *, const char **, int)");
  }
  if (needles == (char **)0x0) {
    __assert_fail("needles != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x261,"_Bool str_matches_any(const char *, const char **, int)");
  }
  if (num_needles < 0) {
    __assert_fail("num_needles >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x262,"_Bool str_matches_any(const char *, const char **, int)");
  }
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if ((uint)num_needles == uVar3) break;
    if (needles[uVar3] == (char *)0x0) {
      __assert_fail("needles[i] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                    ,0x265,"_Bool str_matches_any(const char *, const char **, int)");
    }
    iVar2 = strcmp(haystack,needles[uVar3]);
    uVar1 = uVar3 + 1;
  } while (iVar2 != 0);
  return uVar3 < (uint)num_needles;
}

Assistant:

bool str_matches_any(const char *haystack, const char **needles, int num_needles)
{
    assert(haystack != NULL);
    assert(needles != NULL);
    assert(num_needles >= 0);

    for (int i = 0; i < num_needles; i++) {
        assert(needles[i] != NULL);
        if (!strcmp(haystack, needles[i]))
            return true;
    }

    return false;
}